

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_get_virtual_filename(char *filename,char *virtual_filename)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  int prefix_len;
  
  iVar1 = _compactor_prefix_len(in_RSI);
  iVar1 = iVar1 + -1;
  if (iVar1 < 1) {
    strcpy(in_RSI,in_RDI);
  }
  else {
    strncpy(in_RSI,in_RDI,(long)iVar1);
    in_RSI[iVar1] = '\0';
  }
  return;
}

Assistant:

void compactor_get_virtual_filename(const char *filename,
                                    char *virtual_filename)
{
    int prefix_len = _compactor_prefix_len((char*)filename) - 1;
    if (prefix_len > 0) {
        strncpy(virtual_filename, filename, prefix_len);
        virtual_filename[prefix_len] = 0;
    } else {
        strcpy(virtual_filename, filename);
    }
}